

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# custom.cpp
# Opt level: O1

int main(int param_1,char **param_2)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  int iVar5;
  int extraout_EAX;
  long lVar6;
  DirectFormII *pDVar7;
  Biquad *__end0;
  Biquad (*__range3) [2];
  double *pdVar8;
  double (*sosCoefficients) [2] [6];
  double *pdVar9;
  CascadeStages<2,_Iir::DirectFormII> *pCVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  SOSCascade<2,_Iir::DirectFormII> f;
  double coeff [2] [6];
  double adStack_110 [2];
  DirectFormII *pDStack_100;
  CascadeStages<2,_Iir::DirectFormII> local_e8;
  double local_68 [12];
  
  pCVar10 = &local_e8;
  pdVar8 = (double *)&DAT_00103030;
  pdVar9 = local_68;
  for (lVar6 = 0xc; lVar6 != 0; lVar6 = lVar6 + -1) {
    *pdVar9 = *pdVar8;
    pdVar8 = pdVar8 + 1;
    pdVar9 = pdVar9 + 1;
  }
  lVar6 = 0;
  do {
    *(undefined8 *)((long)&local_e8.m_stages[0].m_a0 + lVar6) = 0x3ff0000000000000;
    *(undefined8 *)((long)&local_e8.m_stages[0].m_a1 + lVar6) = 0;
    *(undefined8 *)((long)&local_e8.m_stages[0].m_a2 + lVar6) = 0;
    *(undefined8 *)((long)&local_e8.m_stages[0].m_b1 + lVar6) = 0;
    *(undefined8 *)((long)&local_e8.m_stages[0].m_b2 + lVar6) = 0;
    *(undefined8 *)((long)&local_e8.m_stages[0].m_b0 + lVar6) = 0x3ff0000000000000;
    lVar6 = lVar6 + 0x30;
  } while (lVar6 != 0x60);
  local_e8.m_states[1].m_v1 = 0.0;
  local_e8.m_states[1].m_v2 = 0.0;
  local_e8.m_states[0].m_v1 = 0.0;
  local_e8.m_states[0].m_v2 = 0.0;
  sosCoefficients = (double (*) [2] [6])local_68;
  Iir::CascadeStages<2,_Iir::DirectFormII>::setup(&local_e8,sosCoefficients);
  lVar6 = 0x28;
  do {
    pdVar8 = (double *)((long)&local_e8.m_states[1].m_v1 + lVar6);
    if ((*(double *)((long)adStack_110 + lVar6) != *pdVar8) ||
       (NAN(*(double *)((long)adStack_110 + lVar6)) || NAN(*pdVar8))) {
      main_cold_9();
LAB_0010162b:
      main_cold_8();
LAB_00101630:
      main_cold_6();
LAB_00101635:
      main_cold_7();
LAB_0010163a:
      main_cold_5();
LAB_0010163f:
      main_cold_4();
      goto LAB_00101644;
    }
    dVar11 = *(double *)((long)adStack_110 + lVar6 + 8);
    pdVar8 = (double *)((long)local_68 + lVar6 + -8);
    if ((dVar11 != *pdVar8) || (NAN(dVar11) || NAN(*pdVar8))) goto LAB_0010162b;
    if ((*(double *)((long)&pDStack_100 + lVar6) != *(double *)((long)local_68 + lVar6)) ||
       (NAN(*(double *)((long)&pDStack_100 + lVar6)) || NAN(*(double *)((long)local_68 + lVar6))))
    goto LAB_00101635;
    dVar11 = *(double *)((long)&local_e8.m_stages[0].m_a0 + lVar6);
    pdVar8 = (double *)((long)&local_e8.m_stages[1].m_b0 + lVar6);
    if ((dVar11 != *pdVar8) || (NAN(dVar11) || NAN(*pdVar8))) goto LAB_00101630;
    dVar11 = *(double *)((long)local_e8.m_stages + lVar6 + -0x10);
    pdVar8 = (double *)((long)&local_e8.m_states[0].m_v1 + lVar6);
    if ((dVar11 != *pdVar8) || (NAN(dVar11) || NAN(*pdVar8))) goto LAB_0010163a;
    dVar11 = *(double *)((long)local_e8.m_stages + lVar6 + -8);
    pdVar8 = (double *)((long)&local_e8.m_states[0].m_v2 + lVar6);
    if ((dVar11 != *pdVar8) || (NAN(dVar11) || NAN(*pdVar8))) goto LAB_0010163f;
    lVar6 = lVar6 + 0x30;
  } while (lVar6 == 0x58);
  iVar5 = 0;
  dVar11 = 0.0;
  while( true ) {
    dVar12 = 1.0;
    if (iVar5 != 10) {
      dVar12 = 0.0;
    }
    lVar6 = 0x28;
    pDVar7 = local_e8.m_states;
    do {
      dVar1 = pDVar7->m_v1;
      dVar2 = pDVar7->m_v2;
      dVar13 = (dVar12 - *(double *)((long)adStack_110 + lVar6 + 8) * dVar1) -
               *(double *)((long)&pDStack_100 + lVar6) * dVar2;
      dVar12 = *(double *)((long)local_e8.m_stages + lVar6 + -0x10);
      dVar3 = *(double *)((long)&local_e8.m_stages[0].m_a0 + lVar6);
      dVar4 = *(double *)((long)local_e8.m_stages + lVar6 + -8);
      pDVar7->m_v2 = dVar1;
      pDVar7->m_v1 = dVar13;
      dVar12 = dVar2 * dVar4 + dVar3 * dVar13 + dVar12 * dVar1;
      lVar6 = lVar6 + 0x30;
      pDVar7 = pDVar7 + 1;
    } while (lVar6 != 0x88);
    if (NAN(dVar12)) break;
    if ((((iVar5 - 0x15U < 0x4f) && (dVar11 == 0.0)) && (!NAN(dVar11))) &&
       ((dVar12 == 0.0 && (!NAN(dVar12))))) goto LAB_00101649;
    iVar5 = iVar5 + 1;
    dVar11 = dVar12;
    if (iVar5 == 10000) {
      main_cold_1();
      return 0;
    }
  }
LAB_00101644:
  main_cold_3();
LAB_00101649:
  main_cold_2();
  lVar6 = 0;
  pDStack_100 = local_e8.m_states;
  do {
    adStack_110[1] = 5.20918113692718e-318;
    Iir::Biquad::setCoefficients
              ((Biquad *)((long)pCVar10 + lVar6),
               *(double *)((long)(*sosCoefficients)[0] + lVar6 + 0x18),
               *(double *)((long)(*sosCoefficients)[0] + lVar6 + 0x20),
               *(double *)((long)(*sosCoefficients)[0] + lVar6 + 0x28),
               *(double *)((long)(*sosCoefficients)[0] + lVar6),
               *(double *)((long)(*sosCoefficients)[0] + lVar6 + 8),
               *(double *)((long)(*sosCoefficients)[0] + lVar6 + 0x10));
    lVar6 = lVar6 + 0x30;
  } while (lVar6 == 0x30);
  return extraout_EAX;
}

Assistant:

int main (int,char**)
{
	// generated with: "elliptic_design.py"
	const double coeff[][6] = {
		{1.665623674062209972e-02,
		 -3.924801366970616552e-03,
		 1.665623674062210319e-02,
		 1.000000000000000000e+00,
		 -1.715403014004022175e+00,
		 8.100474793174089472e-01},
		{1.000000000000000000e+00,
		 -1.369778997100624895e+00,
		 1.000000000000000222e+00,
		 1.000000000000000000e+00,
		 -1.605878925999785656e+00,
		 9.538657786383895054e-01}};

	Iir::Custom::SOSCascade<2> f(coeff);

	auto coeffRet = f.getCascadeStorage();
	for(int i = 0; i < 2; i++) {
	    assert_print(coeffRet.stageArray[i].m_a0 == coeff[i][3],"m_a0 mismatch.\n");
	    assert_print(coeffRet.stageArray[i].m_a1 == coeff[i][4],"m_a1 mismatch.\n");
	    assert_print(coeffRet.stageArray[i].m_a2 == coeff[i][5],"m_a2 mismatch.\n");
	    assert_print(coeffRet.stageArray[i].m_b0 == coeff[i][0],"m_b0 mismatch.\n");
	    assert_print(coeffRet.stageArray[i].m_b1 == coeff[i][1],"m_b1 mismatch.\n");
	    assert_print(coeffRet.stageArray[i].m_b2 == coeff[i][2],"m_b2 mismatch.\n");
	}

	double b = 0;
	double b2 = 0;
	for(int i=0;i<10000;i++) 
	{
		double a=0;
		if (i==10) a = 1;
		b2 = b;
		b = f.filter(a);
		assert_print(!isnan(b),"Custom filter output is NAN\n");
		if ((i>20) && (i<100)) {
			assert_print((b != 0) || (b2 != 0),
				     "Custom output is zero\n");
		}
	}
	fprintf(stderr,"Final filter value: %e\n",b);
	assert_print(fabs(b) < 1E-25,"Custom filter value for t->inf to high!");

	return 0;
}